

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_inverse(matrix3 *self,matrix3 *mR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  matrix3 inverse;
  
  dVar1 = (self->field_0).m[0];
  dVar2 = (self->field_0).m[4];
  dVar3 = (self->field_0).m[8];
  dVar4 = (self->field_0).m[7];
  dVar5 = (self->field_0).m[5];
  inverse.field_0.m[0] = dVar2 * dVar3 - dVar5 * dVar4;
  dVar6 = (self->field_0).m[3];
  dVar7 = (self->field_0).m[6];
  dVar8 = (self->field_0).m[1];
  dVar9 = (self->field_0).m[2];
  inverse.field_0.m[6] = dVar6 * dVar4 - dVar2 * dVar7;
  dVar12 = dVar9 * inverse.field_0.m[6] +
           (dVar1 * inverse.field_0.m[0] - (dVar6 * dVar3 - dVar5 * dVar7) * dVar8);
  dVar11 = -dVar12;
  if (-dVar12 <= dVar12) {
    dVar11 = dVar12;
  }
  if (1e-05 <= dVar11) {
    inverse.field_0.m[1] = dVar4 * dVar9 + -dVar8 * dVar3;
    inverse.field_0.m[2] = dVar5 * dVar8 + -dVar2 * dVar9;
    inverse.field_0.m[3] = dVar5 * dVar7 - dVar6 * dVar3;
    inverse.field_0.m[4] = dVar3 * dVar1 - dVar7 * dVar9;
    inverse.field_0.m[5] = dVar9 * dVar6 - dVar1 * dVar5;
    inverse.field_0.m[7] = dVar8 * dVar7 - dVar4 * dVar1;
    inverse.field_0.m[8] = dVar2 * dVar1 - dVar8 * dVar6;
    lVar10 = 0;
    do {
      (mR->field_0).m[lVar10] = inverse.field_0.m[lVar10] * (1.0 / dVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 9);
    return mR;
  }
  return (matrix3 *)0x0;
}

Assistant:

HYPAPI struct matrix3 *matrix3_inverse(const struct matrix3 *self, struct matrix3 *mR)
{
	struct matrix3 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix3_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix3_identity(&inverse);

	/* find the adjugate of self */
	B(11) = A2(22, 33) - A2(32, 23);
	B(12) = A2(32, 13) - A2(12, 33);
	B(13) = A2(12, 23) - A2(22, 13);

	B(21) = A2(23, 31) - A2(33, 21);
	B(22) = A2(33, 11) - A2(13, 31);
	B(23) = A2(13, 21) - A2(23, 11);

	B(31) = A2(21, 32) - A2(31, 22);
	B(32) = A2(31, 12) - A2(11, 32);
	B(33) = A2(11, 22) - A2(21, 12);

	/* divide the determinant */
	for (i = 0; i < 9; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}